

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::Matchers::IsNaNMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,IsNaNMatcher *this)

{
  s_abi_cxx11_(__return_storage_ptr__,"is NaN",6);
  return __return_storage_ptr__;
}

Assistant:

std::string IsNaNMatcher::describe() const {
    using namespace std::string_literals;
    return "is NaN"s;
}